

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O0

unique_ptr<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_> __thiscall
anon_unknown.dwarf_53533::ParserImpl::ParseForStatement(ParserImpl *this)

{
  TokenDetail *pTVar1;
  undefined8 uVar2;
  long in_RSI;
  __uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true> in_RDI;
  TokenDetail *in_stack_00000030;
  ParseException *in_stack_00000040;
  ParserImpl *in_stack_00000068;
  ParserImpl *in_stack_00000148;
  ParserImpl *in_stack_ffffffffffffffc0;
  
  NextToken(in_stack_ffffffffffffffc0);
  if (*(int *)(in_RSI + 0x20) != 0x107) {
    __assert_fail("current_.token_ == Token_For",
                  "/workspace/llm4binary/github/license_c_cmakelists/airtrack[P]luna/luna/Parser.cpp"
                  ,0x1bb,
                  "std::unique_ptr<SyntaxTree> (anonymous namespace)::ParserImpl::ParseForStatement()"
                 );
  }
  pTVar1 = LookAhead(in_stack_ffffffffffffffc0);
  if (pTVar1->token_ != 0x115) {
    uVar2 = __cxa_allocate_exception(0x20);
    luna::ParseException::ParseException(in_stack_00000040,(char *)this,in_stack_00000030);
    __cxa_throw(uVar2,&luna::ParseException::typeinfo,luna::ParseException::~ParseException);
  }
  pTVar1 = LookAhead2(in_stack_ffffffffffffffc0);
  if (pTVar1->token_ == 0x3d) {
    ParseNumericForStatement(in_stack_00000148);
  }
  else {
    ParseGenericForStatement(in_stack_00000068);
  }
  return (__uniq_ptr_data<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>,_true,_true>)
         (tuple<luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>)
         in_RDI.super___uniq_ptr_impl<luna::SyntaxTree,_std::default_delete<luna::SyntaxTree>_>._M_t
         .super__Tuple_impl<0UL,_luna::SyntaxTree_*,_std::default_delete<luna::SyntaxTree>_>.
         super__Head_base<0UL,_luna::SyntaxTree_*,_false>._M_head_impl;
}

Assistant:

std::unique_ptr<SyntaxTree> ParseForStatement()
        {
            NextToken();                // skip 'for'
            assert(current_.token_ == Token_For);

            if (LookAhead().token_ != Token_Id)
                throw ParseException("expect 'id' after 'for'", look_ahead_);

            if (LookAhead2().token_ == '=')
                return ParseNumericForStatement();
            else
                return ParseGenericForStatement();
        }